

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O2

int __thiscall
jsoncons::jsonpath::detail::
identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  bool bVar1;
  __type_conflict1 _Var2;
  const_object_range_type *pcVar3;
  undefined7 extraout_var;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *current;
  path_node_type *last;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  size_t sVar4;
  size_t extraout_RAX;
  unsigned_long index;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *context;
  const_object_iterator cVar5;
  type tVar6;
  string_view_type sVar7;
  result_options in_stack_00000008;
  int64_t n;
  allocator<char> local_72;
  allocator<char> local_71;
  path_node_type *local_70;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_68;
  unsigned_long local_60;
  identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_58;
  undefined1 local_50 [16];
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  local_40;
  bool local_38;
  
  context = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             *)CONCAT44(in_register_00000034,__nfds);
  local_70 = (path_node_type *)__writefds;
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                    ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     __exceptfds);
  if (bVar1) {
    local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
    local_50._0_8_ = (this->identifier_)._M_string_length;
    local_68 = context;
    local_58 = this;
    cVar5 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                      ((basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)
                       __exceptfds,(string_view_type *)local_50);
    pcVar3 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
             object_range_abi_cxx11_
                       ((const_object_range_type *)local_50,
                        (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)
                        __exceptfds);
    this = local_58;
    context = local_68;
    sVar4 = CONCAT71((int7)((ulong)pcVar3 >> 8),local_38);
    if ((((undefined1  [16])cVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       ((local_38 & 1U) == 0)) {
      bVar1 = cVar5.has_value_ == local_38;
    }
    else {
      bVar1 = cVar5.it_._M_current._M_current == local_40._M_current;
    }
    if (bVar1) goto LAB_0034da87;
    local_50._8_8_ = (local_58->identifier_)._M_dataplus._M_p;
    local_50._0_8_ = (local_58->identifier_)._M_string_length;
    last = path_generator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           ::generate(local_68,local_70,(string_view_type *)local_50,in_stack_00000008);
    current = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               *)&(cVar5.it_._M_current._M_current)->value_;
  }
  else {
    bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                      ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       __exceptfds);
    if (bVar1) {
      local_60 = 0;
      tVar6 = jsoncons::detail::dec_to_integer<long,wchar_t>
                        ((this->identifier_)._M_dataplus._M_p,(this->identifier_)._M_string_length,
                         (long *)&local_60);
      if (tVar6.ec == success) {
        index = local_60;
        if ((long)local_60 < 0) {
          sVar4 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             __exceptfds);
          index = sVar4 + local_60;
        }
        sVar4 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                          ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           __exceptfds);
        if (sVar4 <= index) goto LAB_0034da87;
        local_70 = path_generator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   ::generate(context,local_70,index,in_stack_00000008);
        current = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   *)basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                               ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>
                                 *)__exceptfds,index);
        last = local_70;
      }
      else {
        _Var2 = std::operator==(&this->identifier_,&context->length_label_);
        sVar4 = CONCAT71(extraout_var,_Var2);
        if (!_Var2) goto LAB_0034da87;
        basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                  ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   __exceptfds);
        local_50._0_8_ =
             basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                       ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        __exceptfds);
        local_72 = (allocator<char>)0x0;
        current = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   *)eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                     ::create_json<unsigned_long,jsoncons::semantic_tag,std::allocator<char>>
                               ((eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                                 *)context,(unsigned_long *)local_50,(semantic_tag *)&local_72,
                                &local_71);
        local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
        local_50._0_8_ = (this->identifier_)._M_string_length;
        last = path_generator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ::generate(context,local_70,(string_view_type *)local_50,in_stack_00000008);
      }
    }
    else {
      bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         __exceptfds);
      sVar4 = CONCAT71(extraout_var_00,bVar1);
      if (!bVar1) goto LAB_0034da87;
      _Var2 = std::operator==(&this->identifier_,&context->length_label_);
      sVar4 = CONCAT71(extraout_var_01,_Var2);
      if (!_Var2) goto LAB_0034da87;
      sVar7 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                        ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         __exceptfds);
      local_60 = unicode_traits::count_codepoints<wchar_t>(sVar7._M_str,sVar7._M_len,strict);
      local_50._0_8_ = local_50._0_8_ & 0xffffffffffffff00;
      local_68 = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                  *)eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                    ::create_json<unsigned_long&,jsoncons::semantic_tag,std::allocator<char>>
                              ((eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                                *)context,&local_60,local_50,&local_72);
      local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
      local_50._0_8_ = (this->identifier_)._M_string_length;
      last = path_generator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ::generate(context,local_70,(string_view_type *)local_50,in_stack_00000008);
      current = local_68;
    }
  }
  base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::tail_select(&this->
                 super_base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                ,context,(reference)__readfds,last,(reference)current,
                (node_receiver_type *)__timeout,in_stack_00000008);
  sVar4 = extraout_RAX;
LAB_0034da87:
  return (int)sVar4;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
            reference root,
            const path_node_type& last, 
            reference current,
            node_receiver_type& receiver,
            result_options options) const override
        {
            if (current.is_object())
            {
                auto it = current.find(identifier_);
                if (it != current.object_range().end())
                {
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, identifier_, options),
                                        (*it).value(), receiver, options);
                }
            }
            else if (current.is_array())
            {
                int64_t n{0};
                auto r = jsoncons::detail::dec_to_integer(identifier_.data(), identifier_.size(), n);
                if (r)
                {
                    auto index = (n >= 0) ? static_cast<std::size_t>(n) : static_cast<std::size_t>(static_cast<int64_t>(current.size()) + n);
                    if (index < current.size())
                    {
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, index, options),
                                            current[index], receiver, options);
                    }
                }
                else if (identifier_ == context.length_label() && current.size() >= 0)
                {
                    pointer ptr = context.create_json(current.size(), semantic_tag::none, context.get_allocator());
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, identifier_, options), 
                                        *ptr, 
                                        receiver, options);
                }
            }
            else if (current.is_string() && identifier_ == context.length_label())
            {
                string_view_type sv = current.as_string_view();
                std::size_t count = unicode_traits::count_codepoints(sv.data(), sv.size());
                pointer ptr = context.create_json(count, semantic_tag::none, context.get_allocator());
                this->tail_select(context, root, 
                                    path_generator_type::generate(context, last, identifier_, options), 
                                    *ptr, receiver, options);
            }
            //std::cout << "end identifier_selector\n";
        }